

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_LinearWorkflow::DataCRC(ON_LinearWorkflow *this,ON__UINT32 crc)

{
  int iVar1;
  ON__UINT32 OVar2;
  float dirty;
  float dirty_00;
  bool b [4];
  ON__INT64 f [2];
  
  iVar1 = (*this->_vptr_ON_LinearWorkflow[5])();
  b[0] = SUB41(iVar1,0);
  iVar1 = (*this->_vptr_ON_LinearWorkflow[7])(this);
  b[1] = SUB41(iVar1,0);
  iVar1 = (*this->_vptr_ON_LinearWorkflow[9])(this);
  b[2] = SUB41(iVar1,0);
  iVar1 = (*this->_vptr_ON_LinearWorkflow[0xf])(this);
  b[3] = SUB41(iVar1,0);
  OVar2 = ON_CRC32(crc,4,b);
  (*this->_vptr_ON_LinearWorkflow[0xd])(this);
  f[0] = Integerize(dirty);
  (*this->_vptr_ON_LinearWorkflow[0x11])(this);
  f[1] = Integerize(dirty_00);
  OVar2 = ON_CRC32(OVar2,0x10,f);
  return OVar2;
}

Assistant:

ON__UINT32 ON_LinearWorkflow::DataCRC(ON__UINT32 crc) const
{
  bool b[] = { PreProcessTexturesOn(), PreProcessColorsOn(), PostProcessFrameBufferOn(), PostProcessGammaOn() };
  crc = ON_CRC32(crc, sizeof(b), b);

  ON__INT64 f[] = { Integerize(PreProcessGamma()), Integerize(PostProcessGamma()) };
  crc = ON_CRC32(crc, sizeof(f), f);

  return crc;
}